

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O1

void fill_window(deflate_state *s)

{
  byte bVar1;
  uint uVar2;
  Bytef *pBVar3;
  Posf *pPVar4;
  uint uVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  ushort *puVar9;
  uint uVar10;
  ushort uVar11;
  uInt uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  size_t __n;
  ulg uVar16;
  ulong uVar17;
  bool bVar18;
  
  uVar2 = s->w_size;
  while( true ) {
    uVar10 = (int)s->window_size - (s->lookahead + s->strstart);
    if (s->w_size + (uVar2 - 0x106) <= s->strstart) {
      memcpy(s->window,s->window + uVar2,(ulong)(uVar2 - uVar10));
      s->match_start = s->match_start - uVar2;
      uVar5 = s->strstart - uVar2;
      s->strstart = uVar5;
      s->block_start = s->block_start - (ulong)uVar2;
      if (uVar5 < s->insert) {
        s->insert = uVar5;
      }
      uVar5 = s->w_size;
      uVar8 = (ulong)s->hash_size;
      puVar9 = s->head + uVar8;
      do {
        puVar9 = puVar9 + -1;
        uVar11 = *puVar9 - (short)uVar5;
        if (*puVar9 < uVar5) {
          uVar11 = 0;
        }
        *puVar9 = uVar11;
        uVar7 = (int)uVar8 - 1;
        uVar8 = (ulong)uVar7;
      } while (uVar7 != 0);
      puVar9 = s->prev + uVar5;
      uVar7 = uVar5;
      do {
        puVar9 = puVar9 + -1;
        uVar11 = *puVar9 - (short)uVar5;
        if (*puVar9 < uVar5) {
          uVar11 = 0;
        }
        *puVar9 = uVar11;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
      uVar10 = uVar10 + uVar2;
    }
    if (s->strm->avail_in == 0) break;
    uVar10 = read_buf(s->strm,s->window + (ulong)s->lookahead + (ulong)s->strstart,uVar10);
    uVar10 = uVar10 + s->lookahead;
    s->lookahead = uVar10;
    if (2 < s->insert + uVar10) {
      uVar7 = s->strstart - s->insert;
      uVar8 = (ulong)uVar7;
      pBVar3 = s->window;
      bVar1 = pBVar3[uVar8];
      s->ins_h = (uint)bVar1;
      bVar6 = (byte)s->hash_shift;
      uVar5 = s->hash_mask;
      s->ins_h = ((uint)pBVar3[uVar7 + 1] ^ (uint)bVar1 << (bVar6 & 0x1f)) & uVar5;
      uVar12 = s->insert;
      do {
        bVar18 = uVar12 == 0;
        uVar12 = uVar12 - 1;
        if (bVar18) break;
        uVar7 = (uint)uVar8;
        uVar13 = ((uint)pBVar3[uVar7 + 2] ^ s->ins_h << (bVar6 & 0x1f)) & uVar5;
        s->ins_h = uVar13;
        pPVar4 = s->head;
        s->prev[s->w_mask & uVar7] = pPVar4[uVar13];
        pPVar4[uVar13] = (Posf)uVar8;
        uVar8 = (ulong)(uVar7 + 1);
        s->insert = uVar12;
      } while (2 < uVar10 + uVar12);
    }
    if ((0x105 < uVar10) || (s->strm->avail_in == 0)) break;
  }
  uVar8 = s->high_water;
  uVar15 = s->window_size;
  uVar17 = uVar15 - uVar8;
  if (uVar8 <= uVar15 && uVar17 != 0) {
    uVar14 = (ulong)s->lookahead + (ulong)s->strstart;
    if (uVar8 < uVar14) {
      __n = uVar15 - uVar14;
      if (0x101 < __n) {
        __n = 0x102;
      }
      memset(s->window + uVar14,0,__n);
      uVar16 = __n + uVar14;
    }
    else {
      uVar15 = (uVar14 + 0x102) - uVar8;
      if (uVar14 + 0x102 < uVar8 || uVar15 == 0) {
        return;
      }
      if (uVar15 < uVar17) {
        uVar17 = uVar15;
      }
      memset(s->window + uVar8,0,uVar17 & 0xffffffff);
      uVar16 = uVar17 + s->high_water;
    }
    s->high_water = uVar16;
  }
  return;
}

Assistant:

local void fill_window(s)
    deflate_state *s;
{
    unsigned n;
    unsigned more;    /* Amount of free space at the end of the window. */
    uInt wsize = s->w_size;

    Assert(s->lookahead < MIN_LOOKAHEAD, "already enough lookahead");

    do {
        more = (unsigned)(s->window_size -(ulg)s->lookahead -(ulg)s->strstart);

        /* Deal with !@#$% 64K limit: */
        if (sizeof(int) <= 2) {
            if (more == 0 && s->strstart == 0 && s->lookahead == 0) {
                more = wsize;

            } else if (more == (unsigned)(-1)) {
                /* Very unlikely, but possible on 16 bit machine if
                 * strstart == 0 && lookahead == 1 (input done a byte at time)
                 */
                more--;
            }
        }

        /* If the window is almost full and there is insufficient lookahead,
         * move the upper half to the lower one to make room in the upper half.
         */
        if (s->strstart >= wsize+MAX_DIST(s)) {

            zmemcpy(s->window, s->window+wsize, (unsigned)wsize - more);
            s->match_start -= wsize;
            s->strstart    -= wsize; /* we now have strstart >= MAX_DIST */
            s->block_start -= (long) wsize;
            if (s->insert > s->strstart)
                s->insert = s->strstart;
            slide_hash(s);
            more += wsize;
        }
        if (s->strm->avail_in == 0) break;

        /* If there was no sliding:
         *    strstart <= WSIZE+MAX_DIST-1 && lookahead <= MIN_LOOKAHEAD - 1 &&
         *    more == window_size - lookahead - strstart
         * => more >= window_size - (MIN_LOOKAHEAD-1 + WSIZE + MAX_DIST-1)
         * => more >= window_size - 2*WSIZE + 2
         * In the BIG_MEM or MMAP case (not yet supported),
         *   window_size == input_size + MIN_LOOKAHEAD  &&
         *   strstart + s->lookahead <= input_size => more >= MIN_LOOKAHEAD.
         * Otherwise, window_size == 2*WSIZE so more >= 2.
         * If there was sliding, more >= WSIZE. So in all cases, more >= 2.
         */
        Assert(more >= 2, "more < 2");

        n = read_buf(s->strm, s->window + s->strstart + s->lookahead, more);
        s->lookahead += n;

        /* Initialize the hash value now that we have some input: */
        if (s->lookahead + s->insert >= MIN_MATCH) {
            uInt str = s->strstart - s->insert;
            s->ins_h = s->window[str];
            UPDATE_HASH(s, s->ins_h, s->window[str + 1]);
#if MIN_MATCH != 3
            Call UPDATE_HASH() MIN_MATCH-3 more times
#endif
            while (s->insert) {
                UPDATE_HASH(s, s->ins_h, s->window[str + MIN_MATCH-1]);
#ifndef FASTEST
                s->prev[str & s->w_mask] = s->head[s->ins_h];
#endif
                s->head[s->ins_h] = (Pos)str;
                str++;
                s->insert--;
                if (s->lookahead + s->insert < MIN_MATCH)
                    break;
            }
        }
        /* If the whole input has less than MIN_MATCH bytes, ins_h is garbage,
         * but this is not important since only literal bytes will be emitted.
         */

    } while (s->lookahead < MIN_LOOKAHEAD && s->strm->avail_in != 0);

    /* If the WIN_INIT bytes after the end of the current data have never been
     * written, then zero those bytes in order to avoid memory check reports of
     * the use of uninitialized (or uninitialised as Julian writes) bytes by
     * the longest match routines.  Update the high water mark for the next
     * time through here.  WIN_INIT is set to MAX_MATCH since the longest match
     * routines allow scanning to strstart + MAX_MATCH, ignoring lookahead.
     */
    if (s->high_water < s->window_size) {
        ulg curr = s->strstart + (ulg)(s->lookahead);
        ulg init;

        if (s->high_water < curr) {
            /* Previous high water mark below current data -- zero WIN_INIT
             * bytes or up to end of window, whichever is less.
             */
            init = s->window_size - curr;
            if (init > WIN_INIT)
                init = WIN_INIT;
            zmemzero(s->window + curr, (unsigned)init);
            s->high_water = curr + init;
        }
        else if (s->high_water < (ulg)curr + WIN_INIT) {
            /* High water mark at or above current data, but below current data
             * plus WIN_INIT -- zero out to current data plus WIN_INIT, or up
             * to end of window, whichever is less.
             */
            init = (ulg)curr + WIN_INIT - s->high_water;
            if (init > s->window_size - s->high_water)
                init = s->window_size - s->high_water;
            zmemzero(s->window + s->high_water, (unsigned)init);
            s->high_water += init;
        }
    }

    Assert((ulg)s->strstart <= s->window_size - MIN_LOOKAHEAD,
           "not enough room for search");
}